

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

shared_ptr<fasttext::Matrix> __thiscall
fasttext::FastText::getInputMatrixFromFile(FastText *this,string *filename)

{
  pointer pcVar1;
  FastText *pFVar2;
  char cVar3;
  int32_t iVar4;
  uint uVar5;
  istream *piVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  invalid_argument *piVar8;
  long *plVar9;
  size_type *psVar10;
  _func_int **pp_Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar12;
  EVP_PKEY_CTX *ctx;
  ulong uVar13;
  long lVar14;
  shared_ptr<fasttext::Matrix> sVar15;
  int64_t dim;
  int64_t n;
  DenseMatrix input;
  DenseMatrix mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  ulong local_350;
  ulong local_348;
  undefined1 local_338 [48];
  undefined1 local_308 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  FastText *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)in_RDX,_S_in);
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   in_RDX," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar8,(string *)local_308);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar6 = std::istream::_M_extract<long>((long *)local_238);
  std::istream::_M_extract<long>((long *)piVar6);
  if (local_350 == (long)*(int *)((filename->_M_dataplus)._M_p + 0x4c)) {
    local_2c0 = this;
    DenseMatrix::DenseMatrix((DenseMatrix *)local_308,local_348,local_350);
    if (local_348 != 0) {
      uVar13 = 0;
      do {
        local_338._8_8_ = 0;
        local_338[0x10] = '\0';
        local_338._0_8_ = local_338 + 0x10;
        std::operator>>(local_238,(string *)local_338);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2d8,(value_type *)local_338);
        Dictionary::add((Dictionary *)(filename->field_2)._M_allocated_capacity,
                        (value_type *)local_338);
        if (local_350 != 0) {
          uVar12 = 0;
          do {
            std::istream::_M_extract<float>((float *)local_238);
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_350);
        }
        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < local_348);
    }
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold((Dictionary *)(filename->field_2)._M_allocated_capacity,1,0);
    Dictionary::init((Dictionary *)(filename->field_2)._M_allocated_capacity,ctx);
    iVar4 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
    pcVar1 = (filename->_M_dataplus)._M_p;
    DenseMatrix::DenseMatrix
              ((DenseMatrix *)local_338,(long)iVar4 + (long)*(int *)(pcVar1 + 0x70),
               (long)*(int *)(pcVar1 + 0x4c));
    DenseMatrix::uniform
              ((DenseMatrix *)local_338,1.0 / (float)*(int *)((filename->_M_dataplus)._M_p + 0x4c));
    if (local_348 != 0) {
      lVar14 = 0;
      uVar13 = 0;
      do {
        uVar5 = Dictionary::getId((Dictionary *)(filename->field_2)._M_allocated_capacity,
                                  local_2d8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar13);
        if (-1 < (int)uVar5) {
          iVar4 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
          if (((int)uVar5 < iVar4) && (local_350 != 0)) {
            uVar12 = 0;
            do {
              *(float *)((long)((ulong)uVar5 * CONCAT71(local_338._17_7_,local_338[0x10]) * 4 +
                               local_338._24_8_) + uVar12 * 4) =
                   ((pointer)(local_308._16_8_ * lVar14 + local_308._24_8_))[uVar12];
              uVar12 = uVar12 + 1;
            } while (local_350 != uVar12);
          }
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 4;
      } while (uVar13 < local_348);
    }
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0013f870;
    DenseMatrix::DenseMatrix((DenseMatrix *)(p_Var7 + 1),(DenseMatrix *)local_338);
    pFVar2 = local_2c0;
    (local_2c0->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var7 + 1);
    (local_2c0->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var7;
    if ((void *)local_338._24_8_ != (void *)0x0) {
      operator_delete((void *)local_338._24_8_);
    }
    if ((pointer)local_308._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_308._24_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2d8);
    std::ifstream::~ifstream(local_238);
    sVar15.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar15.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pFVar2;
    return (shared_ptr<fasttext::Matrix>)
           sVar15.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_298,local_350);
  std::operator+(&local_258,"Dimension of pretrained vectors (",&local_298);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
  psVar10 = (size_type *)(plVar9 + 2);
  local_2b8._M_dataplus._M_p = (pointer)*plVar9;
  if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8.field_2._8_8_ = plVar9[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
  }
  local_2b8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::to_string(&local_278,*(int *)((filename->_M_dataplus)._M_p + 0x4c));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 &local_2b8,&local_278);
  plVar9 = (long *)std::__cxx11::string::append(local_338);
  pp_Var11 = (_func_int **)(plVar9 + 2);
  local_308._0_8_ = *plVar9;
  if ((_func_int **)local_308._0_8_ == pp_Var11) {
    local_308._16_8_ = *pp_Var11;
    local_308._24_8_ = plVar9[3];
    local_308._0_8_ = local_308 + 0x10;
  }
  else {
    local_308._16_8_ = *pp_Var11;
  }
  local_308._8_8_ = plVar9[1];
  *plVar9 = (long)pp_Var11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::invalid_argument::invalid_argument(piVar8,(string *)local_308);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<Matrix> FastText::getInputMatrixFromFile(
    const std::string& filename) const {
  std::ifstream in(filename);
  std::vector<std::string> words;
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  DenseMatrix mat(n, dim); // temp. matrix for pretrained vectors
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat.at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  DenseMatrix input(dict_->nwords() + args_->bucket, args_->dim);
  input.uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) {
      continue;
    }
    for (size_t j = 0; j < dim; j++) {
      input.at(idx, j) = mat.at(i, j);
    }
  }
  return std::make_shared<DenseMatrix>(std::move(input));
}